

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O1

Vec3f __thiscall embree::ParseStream::getVec3f(ParseStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _Alloc_hider _Var5;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RSI;
  Vec3f VVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_40,in_RSI);
  _Var5._M_p = local_40._M_dataplus._M_p;
  dVar2 = atof(local_40._M_dataplus._M_p);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar1) {
    operator_delete(_Var5._M_p);
  }
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_40,in_RSI);
  _Var5._M_p = local_40._M_dataplus._M_p;
  dVar3 = atof(local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar1) {
    operator_delete(_Var5._M_p);
  }
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_40,in_RSI);
  dVar4 = atof(local_40._M_dataplus._M_p);
  VVar6.field_0._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  VVar6.field_0._0_4_ = (float)dVar4;
  VVar6.field_0._8_4_ = (float)dVar2;
  (this->
  super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_RefCount._vptr_RefCount = (_func_int **)CONCAT44((float)dVar3,VVar6.field_0._8_4_);
  *(float *)&(this->
             super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       VVar6.field_0._0_4_;
  return (Vec3f)VVar6.field_0;
}

Assistant:

Vec3f getVec3f() {
      float x = (float)atof(get().c_str());
      float y = (float)atof(get().c_str());
      float z = (float)atof(get().c_str());
      return Vec3f(x,y,z);
    }